

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall
duckdb_shell::ShellState::SetOutputFile(ShellState *this,char **azArg,idx_t nArg,char output_mode)

{
  int iVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  char in_CL;
  ShellState *in_RDX;
  long in_RSI;
  ShellState *in_RDI;
  bool bVar4;
  char *z;
  idx_t i;
  int bOnce;
  bool bBOM;
  int eMode;
  int bTxtMode;
  char *zFile;
  ShellState *in_stack_ffffffffffffffb0;
  ShellState *zSuffix;
  uint uVar5;
  uint3 in_stack_ffffffffffffffc4;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  ShellState *local_30;
  bool local_1;
  
  if (safe_mode) {
    fprintf(_stderr,".output/.once/.excel cannot be used in -safe mode\n");
    local_1 = false;
  }
  else {
    local_30 = (ShellState *)0x0;
    uVar8 = 0;
    iVar7 = 0;
    uVar6 = (uint)in_stack_ffffffffffffffc4;
    if (in_CL == 'e') {
      iVar7 = 0x78;
      uVar5 = 2;
    }
    else {
      uVar5 = (uint)(in_CL == 'o');
    }
    for (zSuffix = (ShellState *)0x1; zSuffix < in_RDX;
        zSuffix = (ShellState *)((long)&zSuffix->db + 1)) {
      in_stack_ffffffffffffffb0 = *(ShellState **)(in_RSI + (long)zSuffix * 8);
      if (*(char *)&in_stack_ffffffffffffffb0->db == '-') {
        if (*(char *)((long)&in_stack_ffffffffffffffb0->db + 1) == '-') {
          in_stack_ffffffffffffffb0 = (ShellState *)((long)&in_stack_ffffffffffffffb0->db + 1);
        }
        iVar1 = strcmp((char *)in_stack_ffffffffffffffb0,"-bom");
        if (iVar1 == 0) {
          uVar6 = CONCAT13(1,(int3)uVar6);
        }
        else if ((in_CL == 'e') ||
                (iVar1 = strcmp((char *)in_stack_ffffffffffffffb0,"-x"), iVar1 != 0)) {
          if ((in_CL == 'e') || (iVar1 = strcmp((char *)in_stack_ffffffffffffffb0,"-e"), iVar1 != 0)
             ) {
            fprintf((FILE *)in_RDI->out,"ERROR: unknown option: \"%s\".  Usage:\n",
                    *(undefined8 *)(in_RSI + (long)zSuffix * 8));
            showHelp((FILE *)CONCAT44(uVar8,iVar7),(char *)CONCAT44(uVar6,uVar5));
            return false;
          }
          iVar7 = 0x65;
        }
        else {
          iVar7 = 0x78;
        }
      }
      else {
        bVar4 = local_30 != (ShellState *)0x0;
        local_30 = in_stack_ffffffffffffffb0;
        if (bVar4) {
          fprintf((FILE *)in_RDI->out,"ERROR: extra parameter: \"%s\".  Usage:\n",
                  *(undefined8 *)(in_RSI + (long)zSuffix * 8));
          showHelp((FILE *)CONCAT44(uVar8,iVar7),(char *)CONCAT44(uVar6,uVar5));
          return false;
        }
      }
    }
    if (local_30 == (ShellState *)0x0) {
      local_30 = (ShellState *)0x29d2858;
    }
    if (uVar5 == 0) {
      in_RDI->outCount = 0;
    }
    else {
      in_RDI->outCount = 2;
    }
    ResetOutput(in_RDX);
    if ((iVar7 == 0x65) || (iVar7 == 0x78)) {
      in_RDI->doXdgOpen = '\x01';
      PushOutputMode(in_stack_ffffffffffffffb0);
      if (iVar7 == 0x78) {
        NewTempFile((ShellState *)CONCAT44(uVar6,uVar5),(char *)zSuffix);
        ShellClearFlag(in_RDI,0x40);
        in_RDI->mode = CSV;
        std::__cxx11::string::operator=((string *)&in_RDI->colSeparator,",");
        std::__cxx11::string::operator=((string *)&in_RDI->rowSeparator,"\r\n");
      }
      else {
        NewTempFile((ShellState *)CONCAT44(uVar6,uVar5),(char *)zSuffix);
      }
      local_30 = (ShellState *)in_RDI->zTempFile;
    }
    if (*(char *)&local_30->db == '|') {
      pFVar2 = popen((char *)((long)&local_30->db + 1),"w");
      in_RDI->out = (FILE *)pFVar2;
      if (in_RDI->out == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open pipe \"%s\"\n",(undefined1 *)((long)&local_30->db + 1));
        in_RDI->out = _stdout;
        return false;
      }
      if ((uVar6 & 0x1000000) != 0) {
        fprintf((FILE *)in_RDI->out,anon_var_dwarf_a076);
      }
      std::__cxx11::string::operator=((string *)&in_RDI->outfile,(char *)local_30);
    }
    else {
      pFVar3 = output_file_open((char *)in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
      in_RDI->out = pFVar3;
      if (in_RDI->out == (FILE *)0x0) {
        iVar7 = strcmp((char *)local_30,"off");
        if (iVar7 != 0) {
          fprintf(_stderr,"Error: cannot write to \"%s\"\n",local_30);
        }
        in_RDI->out = _stdout;
        return false;
      }
      if ((uVar6 & 0x1000000) != 0) {
        fprintf((FILE *)in_RDI->out,anon_var_dwarf_a076);
      }
      std::__cxx11::string::operator=((string *)&in_RDI->outfile,(char *)local_30);
    }
    stdout_is_console = false;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ShellState::SetOutputFile(const char **azArg, idx_t nArg, char output_mode) {
	if (safe_mode) {
		utf8_printf(stderr, ".output/.once/.excel cannot be used in -safe mode\n");
		return false;
	}
	const char *zFile = nullptr;
	int bTxtMode = 0;
	int eMode = 0;
	bool bBOM = false;
	int bOnce = 0; /* 0: .output, 1: .once, 2: .excel */

	if (output_mode == 'e') {
		// .excel
		eMode = 'x';
		bOnce = 2;
	} else if (output_mode == 'o') {
		// .once
		bOnce = 1;
	}
	for (idx_t i = 1; i < nArg; i++) {
		const char *z = azArg[i];
		if (z[0] == '-') {
			if (z[1] == '-') {
				z++;
			}
			if (strcmp(z, "-bom") == 0) {
				bBOM = true;
			} else if (output_mode != 'e' && strcmp(z, "-x") == 0) {
				eMode = 'x'; /* spreadsheet */
			} else if (output_mode != 'e' && strcmp(z, "-e") == 0) {
				eMode = 'e'; /* text editor */
			} else {
				utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", azArg[i]);
				showHelp(out, azArg[0]);
				return false;
			}
		} else if (!zFile) {
			zFile = z;
		} else {
			utf8_printf(out, "ERROR: extra parameter: \"%s\".  Usage:\n", azArg[i]);
			showHelp(out, azArg[0]);
			return false;
		}
	}
	if (!zFile) {
		zFile = "stdout";
	}
	if (bOnce) {
		outCount = 2;
	} else {
		outCount = 0;
	}
	ResetOutput();
#ifndef SQLITE_NOHAVE_SYSTEM
	if (eMode == 'e' || eMode == 'x') {
		doXdgOpen = 1;
		PushOutputMode();
		if (eMode == 'x') {
			/* spreadsheet mode.  Output as CSV. */
			NewTempFile("csv");
			ShellClearFlag(SHFLG_Echo);
			mode = RenderMode::CSV;
			colSeparator = SEP_Comma;
			rowSeparator = SEP_CrLf;
		} else {
			/* text editor mode */
			NewTempFile("txt");
			bTxtMode = 1;
		}
		zFile = zTempFile;
	}
#endif /* SQLITE_NOHAVE_SYSTEM */
	if (zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		out = stdout;
		return false;
#else
		out = popen(zFile + 1, "w");
		if (out == 0) {
			utf8_printf(stderr, "Error: cannot open pipe \"%s\"\n", zFile + 1);
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
#endif
	} else {
		out = output_file_open(zFile, bTxtMode);
		if (!out) {
			if (strcmp(zFile, "off") != 0) {
				utf8_printf(stderr, "Error: cannot write to \"%s\"\n", zFile);
			}
			out = stdout;
			return false;
		} else {
			if (bBOM) {
				fprintf(out, "\357\273\277");
			}
			outfile = zFile;
		}
	}
	stdout_is_console = false;
	return true;
}